

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t ismode_w(wchar_t *start,wchar_t *end,wchar_t *permset)

{
  ulong uVar1;
  wchar_t wVar2;
  uint uVar3;
  
  wVar2 = L'\0';
  if (start < end) {
    *permset = L'\0';
    wVar2 = L'\0';
    do {
      uVar3 = *start + L'\xffffffae';
      uVar1 = (ulong)uVar3;
      if (uVar3 < 0x27) {
        if ((0x100000001U >> (uVar1 & 0x3f) & 1) == 0) {
          if ((0x2000000020U >> (uVar1 & 0x3f) & 1) == 0) {
            if ((0x4000000040U >> (uVar1 & 0x3f) & 1) == 0) goto LAB_0028b4e4;
            uVar3 = 1;
          }
          else {
            uVar3 = 2;
          }
        }
        else {
          uVar3 = 4;
        }
        wVar2 = wVar2 | uVar3;
        *permset = wVar2;
      }
      else {
LAB_0028b4e4:
        if (*start != L'-') {
          return L'\0';
        }
      }
      start = start + 1;
    } while (start < end);
    wVar2 = L'\x01';
  }
  return wVar2;
}

Assistant:

static int
ismode_w(const wchar_t *start, const wchar_t *end, int *permset)
{
	const wchar_t *p;

	if (start >= end)
		return (0);
	p = start;
	*permset = 0;
	while (p < end) {
		switch (*p++) {
		case L'r': case L'R':
			*permset |= ARCHIVE_ENTRY_ACL_READ;
			break;
		case L'w': case L'W':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE;
			break;
		case L'x': case L'X':
			*permset |= ARCHIVE_ENTRY_ACL_EXECUTE;
			break;
		case L'-':
			break;
		default:
			return (0);
		}
	}
	return (1);
}